

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.cpp
# Opt level: O2

string * verilogAST::add_tab(string *__return_storage_ptr__,string *block)

{
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  istringstream block_stream;
  byte abStack_190 [352];
  
  std::__cxx11::istringstream::istringstream((istringstream *)&block_stream,(string *)block,_S_in);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while ((abStack_190[*(long *)(_block_stream + -0x18)] & 2) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&block_stream,(string *)&line);
    std::operator+(&local_1f0,"    ",&line);
    std::operator+(&local_1d0,&local_1f0,"\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&line);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&block_stream);
  return __return_storage_ptr__;
}

Assistant:

std::string add_tab(std::string block) {
  // Indents each line by four spaces, adds an extra newline at the end
  std::istringstream block_stream(block);
  std::string new_block;
  while (!block_stream.eof()) {
    std::string line;
    std::getline(block_stream, line);
    new_block += "    " + line + "\n";
  }
  return new_block;
}